

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O2

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  allocator_type local_39;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&bottom_top_blobs,2,&local_39);
  Mat::operator=(bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start,bottom_top_blob);
  Mat::operator=(bottom_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,&this->scale_data);
  iVar1 = (*(this->super_Layer)._vptr_Layer[6])(this,&bottom_top_blobs,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_top_blobs);
  return iVar1;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}